

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

bool helics::priorityCheck
               (int32_t index1,int32_t index2,vector<int,_std::allocator<int>_> *priorities)

{
  bool bVar1;
  reference piVar2;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  int in_EDI;
  const_reverse_iterator priority;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  std::vector<int,_std::allocator<int>_>::rbegin(in_RDX);
  while( true ) {
    std::vector<int,_std::allocator<int>_>::rend(in_RDX);
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)in_RDX);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    piVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator*(in_stack_ffffffffffffffe0);
    if (*piVar2 == in_EDI) break;
    piVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator*(in_stack_ffffffffffffffe0);
    if (*piVar2 == in_ESI) {
      return false;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(in_stack_ffffffffffffffe0);
  }
  return true;
}

Assistant:

static bool priorityCheck(int32_t index1, int32_t index2, const std::vector<int32_t>& priorities)
{
    for (auto priority = priorities.rbegin(); priority != priorities.rend(); ++priority) {
        if (*priority == index1) {
            return true;
        }
        if (*priority == index2) {
            return false;
        }
    }
    return false;
}